

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_fold.c
# Opt level: O0

uint32_t nexttoken(char **pp,int allowlit,int allowany)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  uint32_t in_EDX;
  int in_ESI;
  undefined8 *in_RDI;
  uint32_t j;
  char *r;
  char *q;
  uint32_t i;
  char *p;
  uint local_3c;
  char *local_30;
  uint local_24;
  char *local_20;
  
  local_20 = (char *)*in_RDI;
  if (local_20 == (char *)0x0) {
    return 0;
  }
  pcVar3 = strchr(local_20,0x20);
  local_30 = pcVar3;
  if (pcVar3 != (char *)0x0) {
    local_30 = pcVar3 + 1;
    *pcVar3 = '\0';
  }
  *in_RDI = local_30;
  if ((in_ESI == 0) || (iVar2 = strncmp(local_20,"IRFPM_",6), iVar2 != 0)) {
    if ((in_ESI == 0) || (iVar2 = strncmp(local_20,"IRFL_",5), iVar2 != 0)) {
      if ((in_ESI == 0) || (iVar2 = strncmp(local_20,"IRCALL_",7), iVar2 != 0)) {
        if ((in_ESI == 0) || (iVar2 = strncmp(local_20,"IRCONV_",7), iVar2 != 0)) {
          if (((in_ESI == 0) || (*local_20 < '0')) || ('9' < *local_20)) {
            if ((in_EDX != 0) && (iVar2 = strcmp("any",local_20), iVar2 == 0)) {
              return in_EDX;
            }
            for (local_24 = 0; ir_names[local_24] != (char *)0x0; local_24 = local_24 + 1) {
              iVar2 = strcmp(ir_names[local_24],local_20);
              if (iVar2 == 0) {
                return local_24;
              }
            }
          }
          else {
            local_24 = 0;
            while( true ) {
              bVar1 = false;
              if ('/' < *local_20) {
                bVar1 = *local_20 < ':';
              }
              if (!bVar1) break;
              local_24 = local_24 * 10 + *local_20 + -0x30;
              local_20 = local_20 + 1;
            }
            if (*local_20 == '\0') {
              return local_24;
            }
          }
        }
        else {
          for (local_24 = 0; irt_names[local_24] != (char *)0x0; local_24 = local_24 + 1) {
            pcVar3 = strchr(local_20 + 7,0x5f);
            if ((pcVar3 != (char *)0x0) &&
               (iVar2 = strncmp(irt_names[local_24],local_20 + 7,(long)pcVar3 - (long)(local_20 + 7)
                               ), iVar2 == 0)) {
              for (local_3c = 0; irt_names[local_3c] != (char *)0x0; local_3c = local_3c + 1) {
                iVar2 = strcmp(irt_names[local_3c],pcVar3 + 1);
                if (iVar2 == 0) {
                  return local_24 * 0x20 + local_3c;
                }
              }
            }
          }
        }
      }
      else {
        for (local_24 = 0; ircall_names[local_24] != (char *)0x0; local_24 = local_24 + 1) {
          iVar2 = strcmp(ircall_names[local_24],local_20 + 7);
          if (iVar2 == 0) {
            return local_24;
          }
        }
      }
    }
    else {
      for (local_24 = 0; irfield_names[local_24] != (char *)0x0; local_24 = local_24 + 1) {
        iVar2 = strcmp(irfield_names[local_24],local_20 + 5);
        if (iVar2 == 0) {
          return local_24;
        }
      }
    }
  }
  else {
    for (local_24 = 0; irfpm_names[local_24] != (char *)0x0; local_24 = local_24 + 1) {
      iVar2 = strcmp(irfpm_names[local_24],local_20 + 6);
      if (iVar2 == 0) {
        return local_24;
      }
    }
  }
  fprintf(_stderr,"Error: bad fold definition token \"%s\" at line %d\n",local_20,
          (ulong)(uint)lineno);
  exit(1);
}

Assistant:

static uint32_t nexttoken(char **pp, int allowlit, int allowany)
{
  char *p = *pp;
  if (p) {
    uint32_t i;
    char *q = strchr(p, ' ');
    if (q) *q++ = '\0';
    *pp = q;
    if (allowlit && !strncmp(p, "IRFPM_", 6)) {
      for (i = 0; irfpm_names[i]; i++)
	if (!strcmp(irfpm_names[i], p+6))
	  return i;
    } else if (allowlit && !strncmp(p, "IRFL_", 5)) {
      for (i = 0; irfield_names[i]; i++)
	if (!strcmp(irfield_names[i], p+5))
	  return i;
    } else if (allowlit && !strncmp(p, "IRCALL_", 7)) {
      for (i = 0; ircall_names[i]; i++)
	if (!strcmp(ircall_names[i], p+7))
	  return i;
    } else if (allowlit && !strncmp(p, "IRCONV_", 7)) {
      for (i = 0; irt_names[i]; i++) {
	const char *r = strchr(p+7, '_');
	if (r && !strncmp(irt_names[i], p+7, r-(p+7))) {
	  uint32_t j;
	  for (j = 0; irt_names[j]; j++)
	    if (!strcmp(irt_names[j], r+1))
	      return (i << 5) + j;
	}
      }
    } else if (allowlit && *p >= '0' && *p <= '9') {
      for (i = 0; *p >= '0' && *p <= '9'; p++)
	i = i*10 + (*p - '0');
      if (*p == '\0')
	return i;
    } else if (allowany && !strcmp("any", p)) {
      return allowany;
    } else {
      for (i = 0; ir_names[i]; i++)
	if (!strcmp(ir_names[i], p))
	  return i;
    }
    fprintf(stderr, "Error: bad fold definition token \"%s\" at line %d\n", p, lineno);
    exit(1);
  }
  return 0;
}